

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# nghttp2_frame.c
# Opt level: O2

int nghttp2_frame_unpack_settings_payload2
              (nghttp2_settings_entry **iv_ptr,size_t *niv_ptr,uint8_t *payload,size_t payloadlen,
              nghttp2_mem *mem)

{
  nghttp2_settings_entry *pnVar1;
  ulong uVar2;
  int iVar3;
  long lVar4;
  
  iVar3 = 0;
  *niv_ptr = payloadlen / 6;
  if (payloadlen < 6) {
    *iv_ptr = (nghttp2_settings_entry *)0x0;
  }
  else {
    pnVar1 = (nghttp2_settings_entry *)nghttp2_mem_malloc(mem,payloadlen / 6 << 3);
    *iv_ptr = pnVar1;
    if (pnVar1 == (nghttp2_settings_entry *)0x0) {
      iVar3 = -0x385;
    }
    else {
      iVar3 = 0;
      lVar4 = 0;
      for (uVar2 = 0; uVar2 < *niv_ptr; uVar2 = uVar2 + 1) {
        nghttp2_frame_unpack_settings_entry
                  ((nghttp2_settings_entry *)((long)&(*iv_ptr)->settings_id + lVar4),payload);
        payload = payload + 6;
        lVar4 = lVar4 + 8;
      }
    }
  }
  return iVar3;
}

Assistant:

int nghttp2_frame_unpack_settings_payload2(nghttp2_settings_entry **iv_ptr,
                                           size_t *niv_ptr,
                                           const uint8_t *payload,
                                           size_t payloadlen,
                                           nghttp2_mem *mem) {
  size_t i;

  *niv_ptr = payloadlen / NGHTTP2_FRAME_SETTINGS_ENTRY_LENGTH;

  if (*niv_ptr == 0) {
    *iv_ptr = NULL;

    return 0;
  }

  *iv_ptr =
      nghttp2_mem_malloc(mem, (*niv_ptr) * sizeof(nghttp2_settings_entry));

  if (*iv_ptr == NULL) {
    return NGHTTP2_ERR_NOMEM;
  }

  for (i = 0; i < *niv_ptr; ++i) {
    size_t off = i * NGHTTP2_FRAME_SETTINGS_ENTRY_LENGTH;
    nghttp2_frame_unpack_settings_entry(&(*iv_ptr)[i], &payload[off]);
  }

  return 0;
}